

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O0

bool tinyusdz::prim::ReconstructShader<tinyusdz::UsdTransform2d>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               UsdTransform2d *transform,string *warn,string *err,PrimReconstructOptions *options)

{
  bool bVar1;
  string *psVar2;
  Property *pPVar3;
  size_type sVar4;
  mapped_type *this;
  ostream *poVar5;
  Property *in_stack_fffffffffffff0c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ee0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ec0 [32];
  string local_ea0 [32];
  ostringstream local_e80 [8];
  ostringstream ss_w;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cf8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cd8 [39];
  allocator local_cb1;
  string local_cb0 [32];
  string local_c90;
  ostringstream local_c70 [8];
  ostringstream ss_e_4;
  allocator local_af1;
  undefined1 local_af0 [32];
  undefined1 local_ad0 [40];
  ParseResult ret_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a68 [39];
  allocator local_a41;
  string local_a40 [32];
  string local_a20;
  ostringstream local_a00 [8];
  ostringstream ss_e_3;
  allocator local_881;
  undefined1 local_880 [32];
  undefined1 local_860 [40];
  ParseResult ret_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f8 [39];
  allocator local_7d1;
  string local_7d0 [32];
  string local_7b0;
  ostringstream local_790 [8];
  ostringstream ss_e_2;
  allocator local_611;
  undefined1 local_610 [32];
  undefined1 local_5f0 [32];
  undefined1 local_5d0 [8];
  ParseResult ret_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588 [39];
  allocator local_561;
  string local_560 [32];
  string local_540;
  ostringstream local_520 [8];
  ostringstream ss_e_1;
  allocator local_3a1;
  string local_3a0;
  string local_380;
  undefined1 local_360 [8];
  ParseResult ret_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318 [39];
  allocator local_2f1;
  string local_2f0 [32];
  string local_2d0;
  ostringstream local_2b0 [8];
  ostringstream ss_e;
  undefined4 local_138;
  allocator local_131;
  undefined1 local_130 [32];
  undefined1 local_110 [32];
  undefined1 local_f0 [8];
  ParseResult ret;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_conflict
  *prop;
  const_iterator __end2;
  const_iterator __begin2;
  PropertyMap *__range2;
  allocator local_91;
  value_type local_90 [4];
  undefined1 local_70 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  string *err_local;
  string *warn_local;
  UsdTransform2d *transform_local;
  ReferenceList *references_local;
  PropertyMap *properties_local;
  Specifier *spec_local;
  
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)err;
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_70);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_90,"info:id",&local_91);
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_70,local_90);
  ::std::__cxx11::string::~string((string *)local_90);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_91);
  __end2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
           ::begin(properties);
  prop = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_conflict
          *)::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
            ::end(properties);
  while (bVar1 = ::std::operator!=(&__end2,(_Self *)&prop), bVar1) {
    ret.err.field_2._8_8_ =
         ::std::
         _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
         ::operator*(&__end2);
    ::std::__cxx11::string::string((string *)local_110,(string *)ret.err.field_2._8_8_);
    psVar2 = (string *)(ret.err.field_2._8_8_ + 0x20);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)local_130,"inputs:in",&local_131);
    pPVar3 = (Property *)local_130;
    (anonymous_namespace)::ParseTypedAttribute<std::array<float,2ul>>
              ((ParseResult *)local_f0,(_anonymous_namespace_ *)local_70,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_110,psVar2,pPVar3,(string *)&transform->in,
               (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)
               in_stack_fffffffffffff0c8);
    ::std::__cxx11::string::~string((string *)local_130);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_131);
    ::std::__cxx11::string::~string((string *)local_110);
    if ((local_f0._0_4_ == Success) || (local_f0._0_4_ == AlreadyProcessed)) {
      local_138 = 3;
    }
    else if (local_f0._0_4_ == Unmatched) {
      local_138 = 0;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_2b0);
      poVar5 = ::std::operator<<((ostream *)local_2b0,"[error]");
      poVar5 = ::std::operator<<(poVar5,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                );
      poVar5 = ::std::operator<<(poVar5,":");
      poVar5 = ::std::operator<<(poVar5,"ReconstructShader");
      poVar5 = ::std::operator<<(poVar5,"():");
      poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x1242);
      ::std::operator<<(poVar5," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_2f0,"Parsing attribute `{}` failed. Error: {}",&local_2f1);
      fmt::format<char[10],std::__cxx11::string>
                (&local_2d0,(fmt *)local_2f0,(string *)"inputs:in",(char (*) [10])&ret,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar3);
      poVar5 = ::std::operator<<((ostream *)local_2b0,(string *)&local_2d0);
      ::std::operator<<(poVar5,"\n");
      ::std::__cxx11::string::~string((string *)&local_2d0);
      ::std::__cxx11::string::~string(local_2f0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
      if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(local_318,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (ret_1.err.field_2._M_local_buf + 8));
        ::std::__cxx11::string::operator=
                  ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (string *)local_318);
        ::std::__cxx11::string::~string((string *)local_318);
        ::std::__cxx11::string::~string((string *)(ret_1.err.field_2._M_local_buf + 8));
      }
      spec_local._7_1_ = 0;
      local_138 = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_2b0);
    }
    anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_f0);
    if (local_138 == 0) {
      ::std::__cxx11::string::string((string *)&local_380,(string *)ret.err.field_2._8_8_);
      pPVar3 = (Property *)(ret.err.field_2._8_8_ + 0x20);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_3a0,"inputs:rotation",&local_3a1);
      psVar2 = &local_3a0;
      anon_unknown_0::ParseTypedAttribute<float>
                ((ParseResult *)local_360,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_70,&local_380,pPVar3,psVar2,&transform->rotation);
      ::std::__cxx11::string::~string((string *)&local_3a0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
      ::std::__cxx11::string::~string((string *)&local_380);
      if ((local_360._0_4_ == DefineOnly) || (local_360._0_4_ == PathVector)) {
        local_138 = 3;
      }
      else if (local_360._0_4_ == Path) {
        local_138 = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_520);
        poVar5 = ::std::operator<<((ostream *)local_520,"[error]");
        poVar5 = ::std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar5 = ::std::operator<<(poVar5,":");
        poVar5 = ::std::operator<<(poVar5,"ReconstructShader");
        poVar5 = ::std::operator<<(poVar5,"():");
        poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x1244);
        ::std::operator<<(poVar5," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_560,"Parsing attribute `{}` failed. Error: {}",&local_561);
        fmt::format<char[16],std::__cxx11::string>
                  (&local_540,(fmt *)local_560,(string *)"inputs:rotation",(char (*) [16])&ret_1,
                   psVar2);
        poVar5 = ::std::operator<<((ostream *)local_520,(string *)&local_540);
        ::std::operator<<(poVar5,"\n");
        ::std::__cxx11::string::~string((string *)&local_540);
        ::std::__cxx11::string::~string(local_560);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_561);
        if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_588,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (ret_2.err.field_2._M_local_buf + 8));
          ::std::__cxx11::string::operator=
                    ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (string *)local_588);
          ::std::__cxx11::string::~string((string *)local_588);
          ::std::__cxx11::string::~string((string *)(ret_2.err.field_2._M_local_buf + 8));
        }
        spec_local._7_1_ = 0;
        local_138 = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_520);
      }
      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_360);
      if (local_138 != 0) goto joined_r0x002e96d7;
      ::std::__cxx11::string::string((string *)local_5f0,(string *)ret.err.field_2._8_8_);
      psVar2 = (string *)(ret.err.field_2._8_8_ + 0x20);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)local_610,"inputs:scale",&local_611);
      pPVar3 = (Property *)local_610;
      (anonymous_namespace)::ParseTypedAttribute<std::array<float,2ul>>
                ((ParseResult *)local_5d0,(_anonymous_namespace_ *)local_70,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_5f0,psVar2,pPVar3,(string *)&transform->scale,
                 (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)
                 in_stack_fffffffffffff0c8);
      ::std::__cxx11::string::~string((string *)local_610);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_611);
      ::std::__cxx11::string::~string((string *)local_5f0);
      if ((local_5d0._0_4_ == Success) || (local_5d0._0_4_ == AlreadyProcessed)) {
        local_138 = 3;
      }
      else if (local_5d0._0_4_ == Unmatched) {
        local_138 = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_790);
        poVar5 = ::std::operator<<((ostream *)local_790,"[error]");
        poVar5 = ::std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar5 = ::std::operator<<(poVar5,":");
        poVar5 = ::std::operator<<(poVar5,"ReconstructShader");
        poVar5 = ::std::operator<<(poVar5,"():");
        poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x1246);
        ::std::operator<<(poVar5," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_7d0,"Parsing attribute `{}` failed. Error: {}",&local_7d1);
        fmt::format<char[13],std::__cxx11::string>
                  (&local_7b0,(fmt *)local_7d0,(string *)"inputs:scale",(char (*) [13])&ret_2,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar3);
        poVar5 = ::std::operator<<((ostream *)local_790,(string *)&local_7b0);
        ::std::operator<<(poVar5,"\n");
        ::std::__cxx11::string::~string((string *)&local_7b0);
        ::std::__cxx11::string::~string(local_7d0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_7d1);
        if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_7f8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (ret_3.err.field_2._M_local_buf + 8));
          ::std::__cxx11::string::operator=
                    ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (string *)local_7f8);
          ::std::__cxx11::string::~string((string *)local_7f8);
          ::std::__cxx11::string::~string((string *)(ret_3.err.field_2._M_local_buf + 8));
        }
        spec_local._7_1_ = 0;
        local_138 = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_790);
      }
      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_5d0);
      if (local_138 != 0) goto joined_r0x002e96d7;
      ::std::__cxx11::string::string((string *)local_860,(string *)ret.err.field_2._8_8_);
      psVar2 = (string *)(ret.err.field_2._8_8_ + 0x20);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)local_880,"inputs:translation",&local_881);
      pPVar3 = (Property *)local_880;
      (anonymous_namespace)::ParseTypedAttribute<std::array<float,2ul>>
                ((ParseResult *)(local_860 + 0x20),(_anonymous_namespace_ *)local_70,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_860,psVar2,pPVar3,(string *)&transform->translation,
                 (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)
                 in_stack_fffffffffffff0c8);
      ::std::__cxx11::string::~string((string *)local_880);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_881);
      ::std::__cxx11::string::~string((string *)local_860);
      if ((local_860._32_4_ == 0) || (local_860._32_4_ == 2)) {
        local_138 = 3;
      }
      else if (local_860._32_4_ == 1) {
        local_138 = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_a00);
        poVar5 = ::std::operator<<((ostream *)local_a00,"[error]");
        poVar5 = ::std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar5 = ::std::operator<<(poVar5,":");
        poVar5 = ::std::operator<<(poVar5,"ReconstructShader");
        poVar5 = ::std::operator<<(poVar5,"():");
        poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x1248);
        ::std::operator<<(poVar5," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_a40,"Parsing attribute `{}` failed. Error: {}",&local_a41);
        fmt::format<char[19],std::__cxx11::string>
                  (&local_a20,(fmt *)local_a40,(string *)"inputs:translation",(char (*) [19])&ret_3,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar3);
        poVar5 = ::std::operator<<((ostream *)local_a00,(string *)&local_a20);
        ::std::operator<<(poVar5,"\n");
        ::std::__cxx11::string::~string((string *)&local_a20);
        ::std::__cxx11::string::~string(local_a40);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_a41);
        if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_a68,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (ret_4.err.field_2._M_local_buf + 8));
          ::std::__cxx11::string::operator=
                    ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (string *)local_a68);
          ::std::__cxx11::string::~string((string *)local_a68);
          ::std::__cxx11::string::~string((string *)(ret_4.err.field_2._M_local_buf + 8));
        }
        spec_local._7_1_ = 0;
        local_138 = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_a00);
      }
      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)(local_860 + 0x20));
      if (local_138 != 0) goto joined_r0x002e96d7;
      ::std::__cxx11::string::string((string *)local_ad0,(string *)ret.err.field_2._8_8_);
      psVar2 = (string *)(ret.err.field_2._8_8_ + 0x20);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)local_af0,"outputs:result",&local_af1);
      pPVar3 = (Property *)local_af0;
      (anonymous_namespace)::ParseShaderOutputTerminalAttribute<std::array<float,2ul>>
                ((ParseResult *)(local_ad0 + 0x20),(_anonymous_namespace_ *)local_70,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_ad0,psVar2,pPVar3,(string *)&transform->result,
                 (TypedTerminalAttribute<std::array<float,_2UL>_> *)in_stack_fffffffffffff0c8);
      ::std::__cxx11::string::~string((string *)local_af0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_af1);
      ::std::__cxx11::string::~string((string *)local_ad0);
      if ((local_ad0._32_4_ == 0) || (local_ad0._32_4_ == 2)) {
        local_138 = 3;
      }
      else if (local_ad0._32_4_ == 1) {
        local_138 = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_c70);
        poVar5 = ::std::operator<<((ostream *)local_c70,"[error]");
        poVar5 = ::std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar5 = ::std::operator<<(poVar5,":");
        poVar5 = ::std::operator<<(poVar5,"ReconstructShader");
        poVar5 = ::std::operator<<(poVar5,"():");
        poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x124a);
        ::std::operator<<(poVar5," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_cb0,"Parsing shader output property `{}` failed. Error: {}",&local_cb1);
        fmt::format<char[15],std::__cxx11::string>
                  (&local_c90,(fmt *)local_cb0,(string *)"outputs:result",(char (*) [15])&ret_4,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar3);
        poVar5 = ::std::operator<<((ostream *)local_c70,(string *)&local_c90);
        ::std::operator<<(poVar5,"\n");
        ::std::__cxx11::string::~string((string *)&local_c90);
        ::std::__cxx11::string::~string(local_cb0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_cb1);
        if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_cd8,local_cf8);
          ::std::__cxx11::string::operator=
                    ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (string *)local_cd8);
          ::std::__cxx11::string::~string((string *)local_cd8);
          ::std::__cxx11::string::~string((string *)local_cf8);
        }
        spec_local._7_1_ = 0;
        local_138 = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_c70);
      }
      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)(local_ad0 + 0x20));
      if (local_138 != 0) goto joined_r0x002e96d7;
      sVar4 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_70,(key_type *)ret.err.field_2._8_8_);
      if (sVar4 == 0) {
        in_stack_fffffffffffff0c8 = (Property *)(ret.err.field_2._8_8_ + 0x20);
        this = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               ::operator[](&(transform->super_ShaderNode).super_UsdShadePrim.props,
                            (key_type *)ret.err.field_2._8_8_);
        Property::operator=(this,in_stack_fffffffffffff0c8);
        ::std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_70,(value_type *)ret.err.field_2._8_8_);
      }
      sVar4 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_70,(key_type *)ret.err.field_2._8_8_);
      if (sVar4 == 0) {
        ::std::__cxx11::ostringstream::ostringstream(local_e80);
        poVar5 = ::std::operator<<((ostream *)local_e80,"[warn]");
        poVar5 = ::std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar5 = ::std::operator<<(poVar5,":");
        poVar5 = ::std::operator<<(poVar5,"ReconstructShader");
        poVar5 = ::std::operator<<(poVar5,"():");
        poVar5 = (ostream *)::std::ostream::operator<<(poVar5,0x124c);
        ::std::operator<<(poVar5," ");
        ::std::operator+((char *)local_ea0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "Unsupported/unimplemented property: ");
        poVar5 = ::std::operator<<((ostream *)local_e80,local_ea0);
        ::std::operator<<(poVar5,"\n");
        ::std::__cxx11::string::~string(local_ea0);
        if (warn != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_ec0,local_ee0);
          ::std::__cxx11::string::operator=((string *)warn,(string *)local_ec0);
          ::std::__cxx11::string::~string((string *)local_ec0);
          ::std::__cxx11::string::~string((string *)local_ee0);
        }
        ::std::__cxx11::ostringstream::~ostringstream(local_e80);
      }
    }
    else {
joined_r0x002e96d7:
      if (local_138 != 3) goto LAB_002e98b2;
    }
    ::std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
    ::operator++(&__end2);
  }
  spec_local._7_1_ = 1;
LAB_002e98b2:
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_70);
  return (bool)(spec_local._7_1_ & 1);
}

Assistant:

bool ReconstructShader<UsdTransform2d>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    UsdTransform2d *transform,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)references;
  (void)options;
  std::set<std::string> table;
  table.insert("info:id"); // `info:id` is already parsed in ReconstructPrim<Shader>
  for (auto &prop : properties) {
    DCOUT("prop = " << prop.first);
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:in", UsdTransform2d,
                   transform->in)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:rotation", UsdTransform2d,
                   transform->rotation)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:scale", UsdTransform2d,
                   transform->scale)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:translation", UsdTransform2d,
                   transform->translation)
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:result",
                                  UsdTransform2d, transform->result)
    ADD_PROPERTY(table, prop, UsdPrimvarReader_float2, transform->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}